

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver.hpp
# Opt level: O3

void make_timelapse(vector<cv::Mat,_std::allocator<cv::Mat>_> *image_list,arguments *args)

{
  char cVar1;
  undefined4 uVar2;
  ostream *poVar3;
  undefined8 extraout_RAX;
  long lVar4;
  undefined8 in_R9;
  ulong uVar5;
  uint total_frames;
  VideoWriter outputVideo;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 local_60;
  VideoWriter local_58 [40];
  
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,color::blue_abi_cxx11_,DAT_00158610);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," Timelapse in progress ",0x17);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,color::reset_abi_cxx11_,DAT_00158670);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  uVar2 = cv::VideoWriter::fourcc('H','2','6','4');
  uVar6 = **(undefined8 **)
            ((image_list->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start + 0x40);
  uVar7 = 0;
  cv::VideoWriter::VideoWriter(local_58);
  local_60 = CONCAT44((int)uVar6,(int)((ulong)uVar6 >> 0x20));
  cv::VideoWriter::open
            (SUB84((double)args->frames,0),local_58,&args->output_file_name,uVar2,&local_60,1,in_R9,
             uVar6,uVar7);
  cVar1 = cv::VideoWriter::isOpened();
  if (cVar1 != '\0') {
    total_frames = (int)((long)(image_list->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(image_list->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>).
                               _M_impl.super__Vector_impl_data._M_start >> 5) * -0x55555555;
    if (0 < (int)total_frames) {
      lVar4 = 0;
      uVar5 = 0;
      do {
        cv::VideoWriter::operator<<
                  (local_58,(image_list->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>).
                            _M_impl.super__Vector_impl_data._M_start + lVar4);
        progress_bar((int)uVar5,total_frames);
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 0x60;
      } while ((total_frames & 0x7fffffff) != uVar5);
    }
    cv::VideoWriter::~VideoWriter(local_58);
    return;
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,color::red_abi_cxx11_,DAT_001585d0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"Could not open the output video for write ",0x2a);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,color::reset_abi_cxx11_,DAT_00158670);
  std::endl<char,std::char_traits<char>>(poVar3);
  _Exit(0);
  cv::VideoWriter::~VideoWriter(local_58);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void make_timelapse(vector<cv::Mat> image_list, arguments args)
{
    cout<< color::blue << " Timelapse in progress "<<color::reset<<endl;
    int codec = VideoWriter::fourcc('H', '2', '6', '4');
    int h = 0, w = 0;
    Size S = image_list[0].size();
    VideoWriter outputVideo;
    outputVideo.open(args.output_file_name, codec, args.frames, S, true);

    if (!outputVideo.isOpened())
    {
        std::cout<< color::red << "Could not open the output video for write " << color::reset << std::endl;
        _Exit(0);
    }

    // frames to video
    int total = image_list.size();
    for (int i = 0; i < total; i++)
    {
        outputVideo << image_list[i];
        progress_bar(i, total);
    }
}